

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_callback_ret.cpp
# Opt level: O2

long data_cb_ret_nframes(cubeb_stream *stream,void *user,void *inputbuffer,void *outputbuffer,
                        long nframes)

{
  Message *message;
  long lVar1;
  long lVar2;
  AssertionResult gtest_ar_;
  AssertHelper local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  String local_40;
  
  LOCK();
  *(int *)user = *user + 1;
  UNLOCK();
  LOCK();
  *(int *)((long)user + 4) = *(int *)((long)user + 4) + 1;
  UNLOCK();
  if (nframes < 1) {
    gtest_ar_.success_ = false;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_48);
    message = testing::Message::operator<<
                        ((Message *)&local_48,
                         (char (*) [42])"nframes should not be 0 in data callback!");
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&local_40,&gtest_ar_,"false","false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_callback_ret.cpp"
               ,0x59,local_40.c_str_);
    testing::internal::AssertHelper::operator=(&local_50,message);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::String::~String(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
  }
  if (outputbuffer != (void *)0x0) {
    lVar1 = 0;
    lVar2 = 0;
    if (0 < nframes) {
      lVar2 = nframes;
    }
    for (; lVar2 != lVar1; lVar1 = lVar1 + 1) {
      *(undefined2 *)((long)outputbuffer + lVar1 * 2) = 0;
    }
  }
  return nframes;
}

Assistant:

long data_cb_ret_nframes(cubeb_stream * stream, void * user, const void * inputbuffer, void * outputbuffer, long nframes)
{
  user_state_callback_ret * u = (user_state_callback_ret *)user;
  u->cb_count++;
  // Every callback returns nframes, so every callback is expected
  u->expected_cb_count++;
  if (nframes < 1) {
    // This shouldn't happen
    EXPECT_TRUE(false) << "nframes should not be 0 in data callback!";
  }
  if (outputbuffer != NULL) {
    // If we have an output buffer insert silence
    short * ob = (short *) outputbuffer;
    for (long i = 0; i < nframes; i++) {
      ob[i] = 0;
    }
  }
  return nframes;
}